

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O2

void htmlDocDumpMemoryFormat(xmlDocPtr cur,xmlChar **mem,int *size,int format)

{
  xmlChar *pxVar1;
  xmlCharEncodingHandler *encoder;
  xmlOutputBufferPtr buf;
  size_t sVar2;
  char *encoding;
  xmlBufPtr buf_00;
  xmlBufPtr *ppxVar3;
  
  xmlInitParser();
  if (size != (int *)0x0 && mem != (xmlChar **)0x0) {
    *mem = (xmlChar *)0x0;
    *size = 0;
    if (cur != (xmlDocPtr)0x0) {
      pxVar1 = htmlGetMetaEncoding(cur);
      encoder = htmlFindOutputEncoder((char *)pxVar1);
      buf = xmlAllocOutputBuffer(encoder);
      if (buf != (xmlOutputBufferPtr)0x0) {
        htmlDocContentDumpFormatOutput(buf,cur,encoding,format);
        xmlOutputBufferFlush(buf);
        if (buf->error == 0) {
          buf_00 = buf->conv;
          if (buf_00 == (xmlBufPtr)0x0) {
            ppxVar3 = &buf->buffer;
            buf_00 = buf->buffer;
          }
          else {
            ppxVar3 = &buf->conv;
          }
          sVar2 = xmlBufUse(buf_00);
          *size = (int)sVar2;
          pxVar1 = xmlBufContent(*ppxVar3);
          pxVar1 = xmlStrndup(pxVar1,*size);
          *mem = pxVar1;
        }
        xmlOutputBufferClose(buf);
        return;
      }
    }
  }
  return;
}

Assistant:

void
htmlDocDumpMemoryFormat(xmlDocPtr cur, xmlChar**mem, int *size, int format) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    const char *encoding;

    xmlInitParser();

    if ((mem == NULL) || (size == NULL))
        return;
    *mem = NULL;
    *size = 0;
    if (cur == NULL)
	return;

    encoding = (const char *) htmlGetMetaEncoding(cur);
    handler = htmlFindOutputEncoder(encoding);
    buf = xmlAllocOutputBuffer(handler);
    if (buf == NULL)
	return;

    htmlDocContentDumpFormatOutput(buf, cur, NULL, format);

    xmlOutputBufferFlush(buf);

    if (!buf->error) {
        if (buf->conv != NULL) {
            *size = xmlBufUse(buf->conv);
            *mem = xmlStrndup(xmlBufContent(buf->conv), *size);
        } else {
            *size = xmlBufUse(buf->buffer);
            *mem = xmlStrndup(xmlBufContent(buf->buffer), *size);
        }
    }

    xmlOutputBufferClose(buf);
}